

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp)

{
  REF_NODE ref_node;
  REF_NODE pRVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  size_t __size;
  long lVar8;
  REF_DBL *pRVar9;
  char *pcVar10;
  REF_DBL (*log_m) [6];
  REF_STATUS RVar11;
  long lVar12;
  REF_MPI pRVar13;
  double dVar14;
  REF_INT n_recept;
  REF_INT n_donor;
  REF_INT *local_1c8;
  void *local_1c0;
  REF_INT *recept_node;
  REF_MPI local_1b0;
  void *local_1a8;
  REF_INT *donor_ret;
  REF_CELL local_198;
  REF_INT *donor_cell;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_log_m;
  REF_NODE local_170;
  REF_INT nodes [27];
  REF_DBL log_parent_m [4] [6];
  
  pRVar13 = ref_interp->ref_mpi;
  ref_node = ref_interp->to_grid->node;
  pRVar1 = ref_interp->from_grid->node;
  n_recept = 0;
  if (0 < (long)ref_node->max) {
    iVar4 = 0;
    lVar8 = 0;
    do {
      if ((-1 < ref_node->global[lVar8]) && (ref_node->ref_mpi->id == ref_node->part[lVar8])) {
        iVar4 = iVar4 + 1;
        n_recept = iVar4;
      }
      lVar8 = lVar8 + 1;
    } while (ref_node->max != lVar8);
  }
  lVar8 = (long)n_recept;
  if (lVar8 < 0) {
    pcVar10 = "malloc recept_bary of REF_DBL negative";
    uVar7 = 0x263;
LAB_001bdab8:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_interpolate",pcVar10);
    RVar11 = 1;
  }
  else {
    local_198 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
    pvVar3 = malloc((ulong)(uint)(n_recept * 4) << 3);
    if (pvVar3 == (void *)0x0) {
      pcVar10 = "malloc recept_bary of REF_DBL NULL";
      uVar7 = 0x263;
    }
    else {
      __size = lVar8 << 2;
      local_1c0 = malloc(__size);
      if (local_1c0 == (void *)0x0) {
        pcVar10 = "malloc recept_cell of REF_INT NULL";
        uVar7 = 0x264;
      }
      else {
        recept_node = (REF_INT *)malloc(__size);
        if (recept_node == (REF_INT *)0x0) {
          pcVar10 = "malloc recept_node of REF_INT NULL";
          uVar7 = 0x265;
        }
        else {
          local_1a8 = malloc(__size);
          if (local_1a8 == (void *)0x0) {
            pcVar10 = "malloc recept_ret of REF_INT NULL";
            uVar7 = 0x266;
          }
          else {
            local_1c8 = (REF_INT *)malloc(__size);
            if (local_1c8 == (REF_INT *)0x0) {
              pcVar10 = "malloc recept_proc of REF_INT NULL";
              uVar7 = 0x267;
            }
            else {
              n_recept = 0;
              local_1b0 = pRVar13;
              local_170 = pRVar1;
              if (0 < ref_node->max) {
                lVar8 = 0;
                lVar12 = 0;
                do {
                  if ((-1 < ref_node->global[lVar12]) &&
                     (ref_node->ref_mpi->id == ref_node->part[lVar12])) {
                    if (ref_interp->cell[lVar12] == -1) {
                      pcVar10 = "node needs to be localized";
                      uVar7 = 0x26c;
                      goto LAB_001bdab8;
                    }
                    uVar2 = ref_node_clip_bary4((REF_DBL *)((long)ref_interp->bary + lVar8),
                                                (REF_DBL *)((long)n_recept * 0x20 + (long)pvVar3));
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x26f,"ref_metric_interpolate",(ulong)uVar2,"clip");
                      return uVar2;
                    }
                    lVar5 = (long)n_recept;
                    local_1c8[lVar5] = ref_interp->part[lVar12];
                    *(REF_INT *)((long)local_1c0 + lVar5 * 4) = ref_interp->cell[lVar12];
                    recept_node[lVar5] = (REF_INT)lVar12;
                    *(REF_INT *)((long)local_1a8 + (long)n_recept * 4) = local_1b0->id;
                    n_recept = n_recept + 1;
                  }
                  lVar12 = lVar12 + 1;
                  lVar8 = lVar8 + 0x20;
                } while (lVar12 < ref_node->max);
              }
              pRVar13 = local_1b0;
              uVar2 = ref_mpi_blindsend(local_1b0,local_1c8,local_1c0,1,n_recept,&donor_cell,
                                        &n_donor,1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x27a,"ref_metric_interpolate",(ulong)uVar2,"blind send cell");
                return uVar2;
              }
              uVar2 = ref_mpi_blindsend(pRVar13,local_1c8,local_1a8,1,n_recept,&donor_ret,&n_donor,1
                                       );
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x27d,"ref_metric_interpolate",(ulong)uVar2,"blind send ret");
                return uVar2;
              }
              uVar2 = ref_mpi_blindsend(pRVar13,local_1c8,recept_node,1,n_recept,&donor_node,
                                        &n_donor,1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x280,"ref_metric_interpolate",(ulong)uVar2,"blind send node");
                return uVar2;
              }
              uVar2 = ref_mpi_blindsend(pRVar13,local_1c8,pvVar3,4,n_recept,&donor_bary,&n_donor,3);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x283,"ref_metric_interpolate",(ulong)uVar2,"blind send bary");
                return uVar2;
              }
              free(local_1c8);
              free(local_1a8);
              if (recept_node != (REF_INT *)0x0) {
                free(recept_node);
              }
              free(local_1c0);
              free(pvVar3);
              if (n_donor < 0) {
                pcVar10 = "malloc donor_log_m of REF_DBL negative";
                uVar7 = 0x28b;
                goto LAB_001bdab8;
              }
              pvVar3 = malloc((ulong)(uint)n_donor * 0x30);
              if (pvVar3 != (void *)0x0) {
                local_1c0 = pvVar3;
                if (0 < n_donor) {
                  lVar8 = 0;
                  do {
                    uVar2 = ref_cell_nodes(local_198,donor_cell[lVar8],nodes);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x28f,"ref_metric_interpolate",(ulong)uVar2,
                             "node needs to be localized");
                      return uVar2;
                    }
                    log_m = log_parent_m;
                    lVar12 = 0;
                    do {
                      uVar2 = ref_node_metric_get_log(local_170,nodes[lVar12],*log_m);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x292,"ref_metric_interpolate",(ulong)uVar2,"log(parentM)");
                        return uVar2;
                      }
                      lVar12 = lVar12 + 1;
                      log_m = log_m + 1;
                    } while (lVar12 != 4);
                    pRVar6 = log_parent_m[0];
                    lVar12 = 0;
                    do {
                      *(undefined8 *)((long)local_1c0 + lVar12 * 8 + lVar8 * 0x30) = 0;
                      dVar14 = 0.0;
                      lVar5 = 0;
                      pRVar9 = pRVar6;
                      do {
                        dVar14 = dVar14 + donor_bary[(ulong)((uint)lVar8 & 0x3fffffff) * 4 + lVar5]
                                          * (*(REF_DBL (*) [6])pRVar9)[0];
                        *(double *)((long)local_1c0 + lVar12 * 8 + lVar8 * 0x30) = dVar14;
                        lVar5 = lVar5 + 1;
                        pRVar9 = (REF_DBL *)((long)pRVar9 + 0x30);
                      } while (lVar5 != 4);
                      lVar12 = lVar12 + 1;
                      pRVar6 = pRVar6 + 1;
                    } while (lVar12 != 6);
                    lVar8 = lVar8 + 1;
                    pRVar13 = local_1b0;
                  } while (lVar8 < n_donor);
                }
                pvVar3 = local_1c0;
                if (donor_cell != (REF_INT *)0x0) {
                  free(donor_cell);
                }
                if (donor_bary != (REF_DBL *)0x0) {
                  free(donor_bary);
                }
                uVar2 = ref_mpi_blindsend(pRVar13,donor_ret,pvVar3,6,n_donor,&recept_log_m,&n_recept
                                          ,3);
                if (uVar2 == 0) {
                  uVar2 = ref_mpi_blindsend(pRVar13,donor_ret,donor_node,1,n_donor,&recept_node,
                                            &n_recept,1);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x2a3,"ref_metric_interpolate",(ulong)uVar2,"blind send node");
                    return uVar2;
                  }
                  free(local_1c0);
                  if (donor_node != (REF_INT *)0x0) {
                    free(donor_node);
                  }
                  if (donor_ret != (REF_INT *)0x0) {
                    free(donor_ret);
                  }
                  if (0 < n_recept) {
                    lVar12 = 0;
                    lVar8 = 0;
                    do {
                      uVar2 = ref_node_metric_set_log
                                        (ref_node,recept_node[lVar8],
                                         (REF_DBL *)((long)recept_log_m + lVar12));
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x2ab,"ref_metric_interpolate",(ulong)uVar2,"set received log met");
                        return uVar2;
                      }
                      lVar8 = lVar8 + 1;
                      lVar12 = lVar12 + 0x30;
                    } while (lVar8 < n_recept);
                  }
                  if (recept_node != (REF_INT *)0x0) {
                    free(recept_node);
                  }
                  if (recept_log_m != (REF_DBL *)0x0) {
                    free(recept_log_m);
                  }
                  return 0;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x2a0,"ref_metric_interpolate",(ulong)uVar2,"blind send bary");
                return uVar2;
              }
              pcVar10 = "malloc donor_log_m of REF_DBL NULL";
              uVar7 = 0x28b;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_interpolate",pcVar10);
    RVar11 = 2;
  }
  return RVar11;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL log_parent_m[4][6];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_log_m, *donor_log_m, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_log_m, 6 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (ibary = 0; ibary < 4; ibary++)
      RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
          "log(parentM)");
    for (im = 0; im < 6; im++) {
      donor_log_m[im + 6 * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_log_m[im + 6 * donation] +=
            donor_bary[ibary + 4 * donation] * log_parent_m[ibary][im];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_log_m, 6, n_donor,
                        (void **)(&recept_log_m), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_log_m);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    RSS(ref_node_metric_set_log(to_node, node, &(recept_log_m[6 * receptor])),
        "set received log met");
  }

  ref_free(recept_node);
  ref_free(recept_log_m);

  return REF_SUCCESS;
}